

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O1

int start_openssh_fixture(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = getenv("OPENSSH_NO_DOCKER");
  iVar2 = 0;
  have_docker = (int)(pcVar3 == (char *)0x0);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = getenv("OPENSSH_SERVER_IMAGE");
    if (pcVar3 != (char *)0x0) {
      iVar2 = 0;
      iVar1 = run_command((char **)0x0,"docker pull %s",pcVar3);
      if (iVar1 == 0) {
        iVar1 = run_command((char **)0x0,"docker tag %s libssh2/openssh_server",pcVar3);
        if (iVar1 == 0) goto LAB_00103512;
      }
    }
    pcVar3 = srcdir_path("openssh_server");
    iVar2 = run_command((char **)0x0,"docker build --quiet -t libssh2/openssh_server %s",pcVar3);
  }
LAB_00103512:
  if (iVar2 == 0) {
    if (have_docker != 0) {
      pcVar3 = getenv("OPENSSH_SERVER_PORT");
      if (pcVar3 != (char *)0x0) {
        iVar2 = run_command(&running_container_id,
                            "docker run --rm -d -p %s:22 libssh2/openssh_server",pcVar3);
        return iVar2;
      }
      iVar2 = run_command(&running_container_id,"docker run --rm -d -p 22 libssh2/openssh_server");
      return iVar2;
    }
    running_container_id = strdup("");
    iVar2 = 0;
  }
  else {
    start_openssh_fixture_cold_1();
  }
  return iVar2;
}

Assistant:

int start_openssh_fixture(void)
{
    int ret;
#ifdef _WIN32
    WSADATA wsadata;

    ret = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(ret) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", ret);
        return 1;
    }
#endif

    have_docker = !getenv("OPENSSH_NO_DOCKER");

    ret = build_openssh_server_docker_image();
    if(!ret) {
        return start_openssh_server(&running_container_id);
    }
    else {
        fprintf(stderr, "Failed to build docker image\n");
        return ret;
    }
}